

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaParserCtxtPtr xmlSchemaNewParserCtxtUseDict(char *URL,xmlDictPtr dict)

{
  xmlSchemaParserCtxtPtr pxVar1;
  xmlChar *pxVar2;
  
  pxVar1 = xmlSchemaParserCtxtCreate();
  if (pxVar1 != (xmlSchemaParserCtxtPtr)0x0) {
    pxVar1->dict = dict;
    xmlDictReference(dict);
    if (URL != (char *)0x0) {
      pxVar2 = xmlDictLookup(dict,(xmlChar *)URL,-1);
      pxVar1->URL = pxVar2;
    }
  }
  return pxVar1;
}

Assistant:

static xmlSchemaParserCtxtPtr
xmlSchemaNewParserCtxtUseDict(const char *URL, xmlDictPtr dict)
{
    xmlSchemaParserCtxtPtr ret;

    ret = xmlSchemaParserCtxtCreate();
    if (ret == NULL)
        return (NULL);
    ret->dict = dict;
    xmlDictReference(dict);
    if (URL != NULL)
	ret->URL = xmlDictLookup(dict, (const xmlChar *) URL, -1);
    return (ret);
}